

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointcloud.cpp
# Opt level: O1

bool __thiscall
ON_3dPointArray::GetClosestPoint
          (ON_3dPointArray *this,ON_3dPoint P,int *closest_point_index,double maximum_distance)

{
  bool bVar1;
  double dVar2;
  int i;
  int local_24;
  double local_20;
  
  local_20 = maximum_distance;
  bVar1 = ON_GetClosestPointInPointList
                    ((this->super_ON_SimpleArray<ON_3dPoint>).m_count,
                     (this->super_ON_SimpleArray<ON_3dPoint>).m_a,P,&local_24);
  if (bVar1) {
    if ((0.0 < local_20) &&
       (dVar2 = ON_3dPoint::DistanceTo(&P,(this->super_ON_SimpleArray<ON_3dPoint>).m_a + local_24),
       local_20 < dVar2)) {
      return false;
    }
    if (closest_point_index != (int *)0x0) {
      *closest_point_index = local_24;
    }
  }
  return bVar1;
}

Assistant:

bool ON_3dPointArray::GetClosestPoint( 
          ON_3dPoint P,
          int* closest_point_index,
          double maximum_distance
          ) const
{
  int i;

  bool rc = ON_GetClosestPointInPointList( m_count, m_a , P, &i );

  if (rc)
  {
    if ( maximum_distance > 0.0 && P.DistanceTo(m_a[i]) > maximum_distance )
    {
      rc = false;
    }
    else if ( closest_point_index )
    {
      *closest_point_index = i;
    }
  }

  return rc;
}